

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubdirCommand.cxx
# Opt level: O3

bool cmSubdirCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  cmMakefile *this;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  undefined8 in_RAX;
  undefined8 uVar6;
  string *psVar7;
  long *plVar8;
  undefined8 *puVar9;
  size_type *psVar10;
  pointer inName;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string srcPath;
  string local_d8;
  undefined4 local_b4;
  string local_b0;
  undefined8 local_90;
  char *local_88;
  undefined8 local_80;
  string local_78;
  string local_58;
  string *local_38;
  
  inName = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  paVar1 = &local_b0.field_2;
  if (inName == pbVar2) {
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    local_b4 = 0;
  }
  else {
    this = status->Makefile;
    local_38 = (string *)&status->Error;
    local_b4 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    local_80 = 0;
    do {
      uVar6 = std::__cxx11::string::compare((char *)inName);
      if ((int)uVar6 == 0) {
        local_80 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)inName);
        if (iVar5 != 0) {
          psVar7 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
          pcVar3 = (psVar7->_M_dataplus)._M_p;
          local_b0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar3,pcVar3 + psVar7->_M_string_length);
          std::__cxx11::string::append((char *)&local_b0);
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_b0,(ulong)(inName->_M_dataplus)._M_p);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          psVar10 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_78.field_2._M_allocated_capacity = *psVar10;
            local_78.field_2._8_8_ = plVar8[3];
          }
          else {
            local_78.field_2._M_allocated_capacity = *psVar10;
            local_78._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_78._M_string_length = plVar8[1];
          *plVar8 = (long)psVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != paVar1) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          bVar4 = cmsys::SystemTools::FileIsDirectory(&local_78);
          if (bVar4) {
            psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            pcVar3 = (psVar7->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d8,pcVar3,pcVar3 + psVar7->_M_string_length);
            std::__cxx11::string::append((char *)&local_d8);
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_d8,(ulong)(inName->_M_dataplus)._M_p);
            psVar10 = puVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_b0.field_2._M_allocated_capacity = *psVar10;
              local_b0.field_2._8_8_ = puVar9[3];
              local_b0._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar10;
              local_b0._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_b0._M_string_length = puVar9[1];
            *puVar9 = psVar10;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            cmMakefile::AddSubDirectory
                      (this,&local_78,&local_b0,(bool)((byte)local_80 & 1),false,false);
LAB_002c64b2:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != paVar1) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            bVar4 = cmsys::SystemTools::FileIsDirectory(inName);
            if (bVar4) {
              psVar7 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              pcVar3 = (psVar7->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d8,pcVar3,pcVar3 + psVar7->_M_string_length);
              std::__cxx11::string::append((char *)&local_d8);
              cmsys::SystemTools::GetFilenameName(&local_58,inName);
              uVar6 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                uVar6 = local_d8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar6 < local_58._M_string_length + local_d8._M_string_length) {
                uVar6 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  uVar6 = local_58.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar6 < local_58._M_string_length + local_d8._M_string_length)
                goto LAB_002c6313;
                puVar9 = (undefined8 *)
                         std::__cxx11::string::replace
                                   ((ulong)&local_58,0,(char *)0x0,(ulong)local_d8._M_dataplus._M_p)
                ;
              }
              else {
LAB_002c6313:
                puVar9 = (undefined8 *)
                         std::__cxx11::string::_M_append
                                   ((char *)&local_d8,(ulong)local_58._M_dataplus._M_p);
              }
              psVar10 = puVar9 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar10) {
                local_b0.field_2._M_allocated_capacity = *psVar10;
                local_b0.field_2._8_8_ = puVar9[3];
                local_b0._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_b0.field_2._M_allocated_capacity = *psVar10;
                local_b0._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_b0._M_string_length = puVar9[1];
              *puVar9 = psVar10;
              puVar9[1] = 0;
              *(undefined1 *)psVar10 = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              cmMakefile::AddSubDirectory
                        (this,inName,&local_b0,(bool)((byte)local_80 & 1),false,false);
              goto LAB_002c64b2;
            }
            local_b0.field_2._8_8_ = (inName->_M_dataplus)._M_p;
            local_b0.field_2._M_allocated_capacity = inName->_M_string_length;
            local_b0._M_dataplus._M_p = (pointer)0x26;
            local_b0._M_string_length = 0x7a6b58;
            local_90 = 0x10;
            local_88 = " does not exist.";
            views._M_len = 3;
            views._M_array = (iterator)&local_b0;
            cmCatViews_abi_cxx11_(&local_d8,views);
            std::__cxx11::string::_M_assign(local_38);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            local_b4 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
        }
      }
      inName = inName + 1;
    } while (inName != pbVar2);
  }
  return (bool)((byte)local_b4 & 1);
}

Assistant:

bool cmSubdirCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  bool res = true;
  bool excludeFromAll = false;
  cmMakefile& mf = status.GetMakefile();

  for (std::string const& i : args) {
    if (i == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (i == "PREORDER") {
      // Ignored
      continue;
    }

    // if they specified a relative path then compute the full
    std::string srcPath = mf.GetCurrentSourceDirectory() + "/" + i;
    if (cmSystemTools::FileIsDirectory(srcPath)) {
      std::string binPath = mf.GetCurrentBinaryDirectory() + "/" + i;
      mf.AddSubDirectory(srcPath, binPath, excludeFromAll, false, false);
    }
    // otherwise it is a full path
    else if (cmSystemTools::FileIsDirectory(i)) {
      // we must compute the binPath from the srcPath, we just take the last
      // element from the source path and use that
      std::string binPath = mf.GetCurrentBinaryDirectory() + "/" +
        cmSystemTools::GetFilenameName(i);
      mf.AddSubDirectory(i, binPath, excludeFromAll, false, false);
    } else {
      status.SetError(cmStrCat("Incorrect SUBDIRS command. Directory: ", i,
                               " does not exist."));
      res = false;
    }
  }
  return res;
}